

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_sse2.c
# Opt level: O2

void quantize_lp(int16_t *iscan_ptr,int16_t *coeff_ptr,intptr_t n_coeffs,int16_t *qcoeff_ptr,
                int16_t *dqcoeff_ptr,__m128i *round0,__m128i *round1,__m128i *quant0,__m128i *quant1
                ,__m128i *dequant0,__m128i *dequant1,__m128i *eob)

{
  int16_t *piVar1;
  short *psVar2;
  short *psVar3;
  short sVar4;
  ushort uVar5;
  short sVar8;
  ushort uVar9;
  short sVar10;
  ushort uVar11;
  short sVar12;
  ushort uVar13;
  short sVar14;
  ushort uVar15;
  short sVar16;
  ushort uVar17;
  short sVar18;
  ushort uVar19;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  short sVar20;
  ushort uVar21;
  short sVar22;
  ushort uVar23;
  short sVar26;
  ushort uVar27;
  short sVar28;
  ushort uVar29;
  short sVar30;
  ushort uVar31;
  short sVar32;
  ushort uVar33;
  short sVar34;
  ushort uVar35;
  short sVar36;
  ushort uVar37;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  short sVar38;
  ushort uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 (*in_stack_00000008) [16];
  undefined1 (*in_stack_00000010) [16];
  undefined1 (*in_stack_00000018) [16];
  
  auVar7 = *(undefined1 (*) [16])(coeff_ptr + n_coeffs);
  auVar25 = *(undefined1 (*) [16])(coeff_ptr + n_coeffs + 8);
  sVar22 = auVar7._0_2_;
  sVar4 = -sVar22;
  sVar26 = auVar7._2_2_;
  sVar8 = -sVar26;
  sVar28 = auVar7._4_2_;
  sVar10 = -sVar28;
  sVar30 = auVar7._6_2_;
  sVar12 = -sVar30;
  sVar32 = auVar7._8_2_;
  sVar14 = -sVar32;
  sVar34 = auVar7._10_2_;
  sVar16 = -sVar34;
  sVar36 = auVar7._12_2_;
  sVar18 = -sVar36;
  sVar38 = auVar7._14_2_;
  sVar20 = -sVar38;
  auVar6._0_2_ = (ushort)(sVar4 < sVar22) * sVar22 | (ushort)(sVar4 >= sVar22) * sVar4;
  auVar6._2_2_ = (ushort)(sVar8 < sVar26) * sVar26 | (ushort)(sVar8 >= sVar26) * sVar8;
  auVar6._4_2_ = (ushort)(sVar10 < sVar28) * sVar28 | (ushort)(sVar10 >= sVar28) * sVar10;
  auVar6._6_2_ = (ushort)(sVar12 < sVar30) * sVar30 | (ushort)(sVar12 >= sVar30) * sVar12;
  auVar6._8_2_ = (ushort)(sVar14 < sVar32) * sVar32 | (ushort)(sVar14 >= sVar32) * sVar14;
  auVar6._10_2_ = (ushort)(sVar16 < sVar34) * sVar34 | (ushort)(sVar16 >= sVar34) * sVar16;
  auVar6._12_2_ = (ushort)(sVar18 < sVar36) * sVar36 | (ushort)(sVar18 >= sVar36) * sVar18;
  auVar6._14_2_ = (ushort)(sVar20 < sVar38) * sVar38 | (ushort)(sVar20 >= sVar38) * sVar20;
  auVar41 = psraw(auVar7,0xf);
  sVar22 = auVar25._0_2_;
  sVar4 = -sVar22;
  sVar26 = auVar25._2_2_;
  sVar8 = -sVar26;
  sVar28 = auVar25._4_2_;
  sVar10 = -sVar28;
  sVar30 = auVar25._6_2_;
  sVar12 = -sVar30;
  sVar32 = auVar25._8_2_;
  sVar14 = -sVar32;
  sVar34 = auVar25._10_2_;
  sVar16 = -sVar34;
  sVar36 = auVar25._12_2_;
  sVar18 = -sVar36;
  sVar38 = auVar25._14_2_;
  sVar20 = -sVar38;
  auVar24._0_2_ = (ushort)(sVar4 < sVar22) * sVar22 | (ushort)(sVar4 >= sVar22) * sVar4;
  auVar24._2_2_ = (ushort)(sVar8 < sVar26) * sVar26 | (ushort)(sVar8 >= sVar26) * sVar8;
  auVar24._4_2_ = (ushort)(sVar10 < sVar28) * sVar28 | (ushort)(sVar10 >= sVar28) * sVar10;
  auVar24._6_2_ = (ushort)(sVar12 < sVar30) * sVar30 | (ushort)(sVar12 >= sVar30) * sVar12;
  auVar24._8_2_ = (ushort)(sVar14 < sVar32) * sVar32 | (ushort)(sVar14 >= sVar32) * sVar14;
  auVar24._10_2_ = (ushort)(sVar16 < sVar34) * sVar34 | (ushort)(sVar16 >= sVar34) * sVar16;
  auVar24._12_2_ = (ushort)(sVar18 < sVar36) * sVar36 | (ushort)(sVar18 >= sVar36) * sVar18;
  auVar24._14_2_ = (ushort)(sVar20 < sVar38) * sVar38 | (ushort)(sVar20 >= sVar38) * sVar20;
  auVar40 = psraw(auVar25,0xf);
  auVar7 = paddsw(auVar6,(undefined1  [16])*round0);
  auVar25 = paddsw(auVar24,*in_stack_00000008);
  auVar7 = pmulhw(auVar7,*in_stack_00000010);
  auVar25 = pmulhw(auVar25,*in_stack_00000018);
  auVar7 = auVar7 ^ auVar41;
  auVar25 = auVar25 ^ auVar40;
  sVar4 = auVar7._0_2_ - auVar41._0_2_;
  sVar8 = auVar7._2_2_ - auVar41._2_2_;
  sVar10 = auVar7._4_2_ - auVar41._4_2_;
  sVar12 = auVar7._6_2_ - auVar41._6_2_;
  sVar14 = auVar7._8_2_ - auVar41._8_2_;
  sVar16 = auVar7._10_2_ - auVar41._10_2_;
  sVar18 = auVar7._12_2_ - auVar41._12_2_;
  sVar20 = auVar7._14_2_ - auVar41._14_2_;
  sVar22 = auVar25._0_2_ - auVar40._0_2_;
  sVar26 = auVar25._2_2_ - auVar40._2_2_;
  sVar28 = auVar25._4_2_ - auVar40._4_2_;
  sVar30 = auVar25._6_2_ - auVar40._6_2_;
  sVar32 = auVar25._8_2_ - auVar40._8_2_;
  sVar34 = auVar25._10_2_ - auVar40._10_2_;
  sVar36 = auVar25._12_2_ - auVar40._12_2_;
  sVar38 = auVar25._14_2_ - auVar40._14_2_;
  piVar1 = qcoeff_ptr + n_coeffs;
  *piVar1 = sVar4;
  piVar1[1] = sVar8;
  piVar1[2] = sVar10;
  piVar1[3] = sVar12;
  piVar1[4] = sVar14;
  piVar1[5] = sVar16;
  piVar1[6] = sVar18;
  piVar1[7] = sVar20;
  piVar1 = qcoeff_ptr + n_coeffs + 8;
  *piVar1 = sVar22;
  piVar1[1] = sVar26;
  piVar1[2] = sVar28;
  piVar1[3] = sVar30;
  piVar1[4] = sVar32;
  piVar1[5] = sVar34;
  piVar1[6] = sVar36;
  piVar1[7] = sVar38;
  sVar4 = sVar4 * (short)(*round1)[0];
  sVar8 = sVar8 * *(short *)((long)*round1 + 2);
  sVar10 = sVar10 * *(short *)((long)*round1 + 4);
  sVar12 = sVar12 * *(short *)((long)*round1 + 6);
  sVar14 = sVar14 * (short)(*round1)[1];
  sVar16 = sVar16 * *(short *)((long)*round1 + 10);
  sVar18 = sVar18 * *(short *)((long)*round1 + 0xc);
  sVar20 = sVar20 * *(short *)((long)*round1 + 0xe);
  sVar22 = sVar22 * (short)(*quant0)[0];
  sVar26 = sVar26 * *(short *)((long)*quant0 + 2);
  sVar28 = sVar28 * *(short *)((long)*quant0 + 4);
  sVar30 = sVar30 * *(short *)((long)*quant0 + 6);
  sVar32 = sVar32 * (short)(*quant0)[1];
  sVar34 = sVar34 * *(short *)((long)*quant0 + 10);
  sVar36 = sVar36 * *(short *)((long)*quant0 + 0xc);
  sVar38 = sVar38 * *(short *)((long)*quant0 + 0xe);
  piVar1 = dqcoeff_ptr + n_coeffs;
  *piVar1 = sVar4;
  piVar1[1] = sVar8;
  piVar1[2] = sVar10;
  piVar1[3] = sVar12;
  piVar1[4] = sVar14;
  piVar1[5] = sVar16;
  piVar1[6] = sVar18;
  piVar1[7] = sVar20;
  piVar1 = dqcoeff_ptr + n_coeffs + 8;
  *piVar1 = sVar22;
  piVar1[1] = sVar26;
  piVar1[2] = sVar28;
  piVar1[3] = sVar30;
  piVar1[4] = sVar32;
  piVar1[5] = sVar34;
  piVar1[6] = sVar36;
  piVar1[7] = sVar38;
  uVar5 = -(ushort)(sVar4 == 0);
  uVar9 = -(ushort)(sVar8 == 0);
  uVar11 = -(ushort)(sVar10 == 0);
  uVar13 = -(ushort)(sVar12 == 0);
  uVar15 = -(ushort)(sVar14 == 0);
  uVar17 = -(ushort)(sVar16 == 0);
  uVar19 = -(ushort)(sVar18 == 0);
  uVar21 = -(ushort)(sVar20 == 0);
  uVar23 = -(ushort)(sVar22 == 0);
  uVar27 = -(ushort)(sVar26 == 0);
  uVar29 = -(ushort)(sVar28 == 0);
  uVar31 = -(ushort)(sVar30 == 0);
  uVar33 = -(ushort)(sVar32 == 0);
  uVar35 = -(ushort)(sVar34 == 0);
  uVar37 = -(ushort)(sVar36 == 0);
  uVar39 = -(ushort)(sVar38 == 0);
  psVar2 = iscan_ptr + n_coeffs;
  psVar3 = iscan_ptr + n_coeffs + 8;
  uVar5 = ~uVar5 & *psVar2 + uVar5 + 1;
  uVar9 = ~uVar9 & psVar2[1] + uVar9 + 1;
  uVar11 = ~uVar11 & psVar2[2] + uVar11 + 1;
  uVar13 = ~uVar13 & psVar2[3] + uVar13 + 1;
  uVar15 = ~uVar15 & psVar2[4] + uVar15 + 1;
  uVar17 = ~uVar17 & psVar2[5] + uVar17 + 1;
  uVar19 = ~uVar19 & psVar2[6] + uVar19 + 1;
  uVar21 = ~uVar21 & psVar2[7] + uVar21 + 1;
  uVar23 = ~uVar23 & *psVar3 + uVar23 + 1;
  uVar27 = ~uVar27 & psVar3[1] + uVar27 + 1;
  uVar29 = ~uVar29 & psVar3[2] + uVar29 + 1;
  uVar31 = ~uVar31 & psVar3[3] + uVar31 + 1;
  uVar33 = ~uVar33 & psVar3[4] + uVar33 + 1;
  uVar35 = ~uVar35 & psVar3[5] + uVar35 + 1;
  uVar37 = ~uVar37 & psVar3[6] + uVar37 + 1;
  uVar39 = ~uVar39 & psVar3[7] + uVar39 + 1;
  uVar5 = ((short)uVar23 < (short)uVar5) * uVar5 | ((short)uVar23 >= (short)uVar5) * uVar23;
  uVar9 = ((short)uVar27 < (short)uVar9) * uVar9 | ((short)uVar27 >= (short)uVar9) * uVar27;
  uVar11 = ((short)uVar29 < (short)uVar11) * uVar11 | ((short)uVar29 >= (short)uVar11) * uVar29;
  uVar13 = ((short)uVar31 < (short)uVar13) * uVar13 | ((short)uVar31 >= (short)uVar13) * uVar31;
  uVar15 = ((short)uVar33 < (short)uVar15) * uVar15 | ((short)uVar33 >= (short)uVar15) * uVar33;
  uVar17 = ((short)uVar35 < (short)uVar17) * uVar17 | ((short)uVar35 >= (short)uVar17) * uVar35;
  uVar19 = ((short)uVar37 < (short)uVar19) * uVar19 | ((short)uVar37 >= (short)uVar19) * uVar37;
  uVar21 = ((short)uVar39 < (short)uVar21) * uVar21 | ((short)uVar39 >= (short)uVar21) * uVar39;
  sVar4 = (short)(*quant1)[0];
  sVar8 = *(short *)((long)*quant1 + 2);
  sVar10 = *(short *)((long)*quant1 + 4);
  sVar12 = *(short *)((long)*quant1 + 6);
  sVar14 = (short)(*quant1)[1];
  sVar16 = *(short *)((long)*quant1 + 10);
  sVar18 = *(short *)((long)*quant1 + 0xc);
  sVar20 = *(short *)((long)*quant1 + 0xe);
  *(ushort *)*quant1 = (ushort)((short)uVar5 < sVar4) * sVar4 | ((short)uVar5 >= sVar4) * uVar5;
  *(ushort *)((long)*quant1 + 2) =
       (ushort)((short)uVar9 < sVar8) * sVar8 | ((short)uVar9 >= sVar8) * uVar9;
  *(ushort *)((long)*quant1 + 4) =
       (ushort)((short)uVar11 < sVar10) * sVar10 | ((short)uVar11 >= sVar10) * uVar11;
  *(ushort *)((long)*quant1 + 6) =
       (ushort)((short)uVar13 < sVar12) * sVar12 | ((short)uVar13 >= sVar12) * uVar13;
  *(ushort *)(*quant1 + 1) =
       (ushort)((short)uVar15 < sVar14) * sVar14 | ((short)uVar15 >= sVar14) * uVar15;
  *(ushort *)((long)*quant1 + 10) =
       (ushort)((short)uVar17 < sVar16) * sVar16 | ((short)uVar17 >= sVar16) * uVar17;
  *(ushort *)((long)*quant1 + 0xc) =
       (ushort)((short)uVar19 < sVar18) * sVar18 | ((short)uVar19 >= sVar18) * uVar19;
  *(ushort *)((long)*quant1 + 0xe) =
       (ushort)((short)uVar21 < sVar20) * sVar20 | ((short)uVar21 >= sVar20) * uVar21;
  return;
}

Assistant:

static inline void quantize_lp(const int16_t *iscan_ptr,
                               const int16_t *coeff_ptr, intptr_t n_coeffs,
                               int16_t *qcoeff_ptr, int16_t *dqcoeff_ptr,
                               const __m128i *round0, const __m128i *round1,
                               const __m128i *quant0, const __m128i *quant1,
                               const __m128i *dequant0, const __m128i *dequant1,
                               __m128i *eob) {
  const int16_t *read = coeff_ptr + n_coeffs;
  __m128i coeff0 = _mm_load_si128((const __m128i *)read);
  __m128i coeff1 = _mm_load_si128((const __m128i *)read + 1);

  // Poor man's sign extract
  const __m128i coeff0_sign = _mm_srai_epi16(coeff0, 15);
  const __m128i coeff1_sign = _mm_srai_epi16(coeff1, 15);
  __m128i qcoeff0 = _mm_xor_si128(coeff0, coeff0_sign);
  __m128i qcoeff1 = _mm_xor_si128(coeff1, coeff1_sign);
  qcoeff0 = _mm_sub_epi16(qcoeff0, coeff0_sign);
  qcoeff1 = _mm_sub_epi16(qcoeff1, coeff1_sign);

  qcoeff0 = _mm_adds_epi16(qcoeff0, *round0);
  qcoeff1 = _mm_adds_epi16(qcoeff1, *round1);
  const __m128i qtmp0 = _mm_mulhi_epi16(qcoeff0, *quant0);
  const __m128i qtmp1 = _mm_mulhi_epi16(qcoeff1, *quant1);

  // Reinsert signs
  qcoeff0 = _mm_xor_si128(qtmp0, coeff0_sign);
  qcoeff1 = _mm_xor_si128(qtmp1, coeff1_sign);
  qcoeff0 = _mm_sub_epi16(qcoeff0, coeff0_sign);
  qcoeff1 = _mm_sub_epi16(qcoeff1, coeff1_sign);

  int16_t *addr = qcoeff_ptr + n_coeffs;
  _mm_store_si128((__m128i *)addr, qcoeff0);
  _mm_store_si128((__m128i *)addr + 1, qcoeff1);

  coeff0 = _mm_mullo_epi16(qcoeff0, *dequant0);
  coeff1 = _mm_mullo_epi16(qcoeff1, *dequant1);

  addr = dqcoeff_ptr + n_coeffs;
  _mm_store_si128((__m128i *)addr, coeff0);
  _mm_store_si128((__m128i *)addr + 1, coeff1);

  const __m128i zero = _mm_setzero_si128();
  // Scan for eob
  const __m128i zero_coeff0 = _mm_cmpeq_epi16(coeff0, zero);
  const __m128i zero_coeff1 = _mm_cmpeq_epi16(coeff1, zero);
  const __m128i nzero_coeff0 = _mm_cmpeq_epi16(zero_coeff0, zero);
  const __m128i nzero_coeff1 = _mm_cmpeq_epi16(zero_coeff1, zero);

  const __m128i iscan0 =
      _mm_load_si128((const __m128i *)(iscan_ptr + n_coeffs));
  const __m128i iscan1 =
      _mm_load_si128((const __m128i *)(iscan_ptr + n_coeffs) + 1);

  // Add one to convert from indices to counts
  const __m128i iscan0_nz = _mm_sub_epi16(iscan0, nzero_coeff0);
  const __m128i iscan1_nz = _mm_sub_epi16(iscan1, nzero_coeff1);
  const __m128i eob0 = _mm_and_si128(iscan0_nz, nzero_coeff0);
  const __m128i eob1 = _mm_and_si128(iscan1_nz, nzero_coeff1);
  const __m128i eob2 = _mm_max_epi16(eob0, eob1);
  *eob = _mm_max_epi16(*eob, eob2);
}